

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

NamespaceData * __thiscall
anon_unknown.dwarf_94284::FindNamespaceInCurrentScope
          (anon_unknown_dwarf_94284 *this,ExpressionContext *ctx,InplaceStr name)

{
  anon_unknown_dwarf_94284 *paVar1;
  bool bVar2;
  NamespaceData *pNVar3;
  NamespaceData **ppNVar4;
  uint i;
  uint index;
  anon_unknown_dwarf_94284 *paVar5;
  ArrayView<NamespaceData_*> local_40;
  InplaceStr local_30;
  
  local_30.end = name.begin;
  local_30.begin = (char *)ctx;
  pNVar3 = ExpressionContext::GetCurrentNamespace
                     ((ExpressionContext *)this,*(ScopeData **)(this + 0x8158));
  paVar5 = this + 0x8178;
  paVar1 = this + 0x8170;
  if (pNVar3 != (NamespaceData *)0x0) {
    paVar5 = (anon_unknown_dwarf_94284 *)&(pNVar3->children).count;
    paVar1 = (anon_unknown_dwarf_94284 *)&pNVar3->children;
  }
  local_40.count = *(uint *)paVar5;
  local_40.data = *(NamespaceData ***)paVar1;
  index = 0;
  while( true ) {
    if (local_40.count <= index) {
      return (NamespaceData *)0x0;
    }
    ppNVar4 = ArrayView<NamespaceData_*>::operator[](&local_40,index);
    bVar2 = InplaceStr::operator==(&((*ppNVar4)->name).name,&local_30);
    if (bVar2) break;
    index = index + 1;
  }
  ppNVar4 = ArrayView<NamespaceData_*>::operator[](&local_40,index);
  return *ppNVar4;
}

Assistant:

NamespaceData* FindNamespaceInCurrentScope(ExpressionContext &ctx, InplaceStr name)
	{
		ArrayView<NamespaceData*> namespaces;

		if(NamespaceData *ns = ctx.GetCurrentNamespace(ctx.scope))
			namespaces = ns->children;
		else
			namespaces = ctx.globalNamespaces;

		for(unsigned i = 0; i < namespaces.size(); i++)
		{
			if(namespaces[i]->name.name == name)
				return namespaces[i];
		}

		return NULL;
	}